

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_log_module.c
# Opt level: O0

uintptr_t ngx_stream_log_escape(u_char *dst,u_char *src,size_t size)

{
  u_char *local_30;
  ngx_uint_t n;
  size_t size_local;
  u_char *src_local;
  u_char *dst_local;
  
  n = size;
  size_local = (size_t)src;
  src_local = dst;
  if (dst == (u_char *)0x0) {
    local_30 = (u_char *)0x0;
    for (; n != 0; n = n - 1) {
      if ((ngx_stream_log_escape::escape[(int)(uint)*(byte *)size_local >> 5] &
          1 << (*(byte *)size_local & 0x1f)) != 0) {
        local_30 = local_30 + 1;
      }
      size_local = size_local + 1;
    }
    dst_local = local_30;
  }
  else {
    for (; n != 0; n = n - 1) {
      if ((ngx_stream_log_escape::escape[(int)(uint)*(byte *)size_local >> 5] &
          1 << (*(byte *)size_local & 0x1f)) == 0) {
        *src_local = *(u_char *)size_local;
        src_local = src_local + 1;
      }
      else {
        *src_local = '\\';
        src_local[1] = 'x';
        src_local[2] = ngx_stream_log_escape::hex[(int)(uint)*(byte *)size_local >> 4];
        src_local[3] = ngx_stream_log_escape::hex[(int)(*(byte *)size_local & 0xf)];
        src_local = src_local + 4;
      }
      size_local = size_local + 1;
    }
    dst_local = src_local;
  }
  return (uintptr_t)dst_local;
}

Assistant:

static uintptr_t
ngx_stream_log_escape(u_char *dst, u_char *src, size_t size)
{
    ngx_uint_t      n;
    static u_char   hex[] = "0123456789ABCDEF";

    static uint32_t   escape[] = {
        0xffffffff, /* 1111 1111 1111 1111  1111 1111 1111 1111 */

                    /* ?>=< ;:98 7654 3210  /.-, +*)( '&%$ #"!  */
        0x00000004, /* 0000 0000 0000 0000  0000 0000 0000 0100 */

                    /* _^]\ [ZYX WVUT SRQP  ONML KJIH GFED CBA@ */
        0x10000000, /* 0001 0000 0000 0000  0000 0000 0000 0000 */

                    /*  ~}| {zyx wvut srqp  onml kjih gfed cba` */
        0x80000000, /* 1000 0000 0000 0000  0000 0000 0000 0000 */

        0xffffffff, /* 1111 1111 1111 1111  1111 1111 1111 1111 */
        0xffffffff, /* 1111 1111 1111 1111  1111 1111 1111 1111 */
        0xffffffff, /* 1111 1111 1111 1111  1111 1111 1111 1111 */
        0xffffffff, /* 1111 1111 1111 1111  1111 1111 1111 1111 */
    };


    if (dst == NULL) {

        /* find the number of the characters to be escaped */

        n = 0;

        while (size) {
            if (escape[*src >> 5] & (1U << (*src & 0x1f))) {
                n++;
            }
            src++;
            size--;
        }

        return (uintptr_t) n;
    }

    while (size) {
        if (escape[*src >> 5] & (1U << (*src & 0x1f))) {
            *dst++ = '\\';
            *dst++ = 'x';
            *dst++ = hex[*src >> 4];
            *dst++ = hex[*src & 0xf];
            src++;

        } else {
            *dst++ = *src++;
        }
        size--;
    }

    return (uintptr_t) dst;
}